

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int luaopen_base(lua_State *L)

{
  lua_State *key;
  TValue *libname;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  GCtab *env;
  lua_State *L_00;
  lua_State *L_01;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  
  key = (lua_State *)(ulong)(in_RDI->env).gcptr32;
  L_00 = key;
  L_01 = in_RDI;
  lj_str_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  libname = lj_tab_setstr(L_00,(GCtab *)in_RDI,(GCstr *)key);
  uVar1 = 0xfffffff4;
  (libname->u32).lo = (uint32_t)L_00;
  (libname->field_2).it = 0xfffffff4;
  lua_pushlstring(L_00,(char *)in_RDI,(size_t)key);
  newproxy_weaktable(L_01);
  lj_lib_register(unaff_retaddr,(char *)&libname->u64,(uint8_t *)L_00,
                  (lua_CFunction *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  lj_lib_register(unaff_retaddr,(char *)&libname->u64,(uint8_t *)L_00,
                  (lua_CFunction *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  return 2;
}

Assistant:

LUALIB_API int luaopen_base(lua_State *L)
{
  /* NOBARRIER: Table and value are the same. */
  GCtab *env = tabref(L->env);
  settabV(L, lj_tab_setstr(L, env, lj_str_newlit(L, "_G")), env);
  lua_pushliteral(L, LUA_VERSION);  /* top-3. */
  newproxy_weaktable(L);  /* top-2. */
  LJ_LIB_REG(L, "_G", base);
  LJ_LIB_REG(L, LUA_COLIBNAME, coroutine);
  return 2;
}